

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_highbd_convolve_x_sr_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  ushort uVar1;
  int16_t *piVar2;
  byte bVar3;
  uint16_t uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  bool bVar11;
  int local_68;
  ulong local_60;
  
  if (0 < h) {
    uVar1 = filter_params_x->taps;
    piVar2 = filter_params_x->filter_ptr;
    bVar3 = (byte)conv_params->round_0;
    local_68 = 1 - (uint)(uVar1 >> 1);
    local_60 = 0;
    do {
      if (0 < w) {
        uVar7 = 0;
        iVar8 = local_68;
        do {
          if ((ulong)filter_params_x->taps == 0) {
            iVar9 = 0;
          }
          else {
            uVar6 = 0;
            iVar9 = 0;
            do {
              iVar9 = iVar9 + (uint)src[(long)iVar8 + uVar6] *
                              (int)*(short *)((long)piVar2 +
                                             uVar6 * 2 +
                                             (ulong)((subpel_x_qn & 0xfU) * (uint)uVar1 * 2));
              uVar6 = uVar6 + 1;
            } while (filter_params_x->taps != uVar6);
          }
          uVar10 = (iVar9 + ((1 << (bVar3 & 0x1f)) >> 1) >> (bVar3 & 0x1f)) +
                   ((1 << (7 - bVar3 & 0x1f)) >> 1) >> (7 - bVar3 & 0x1f);
          if (bd == 10) {
            bVar11 = uVar10 < 0x3ff;
            uVar5 = 0x3ff;
          }
          else if (bd == 0xc) {
            bVar11 = uVar10 < 0xfff;
            uVar5 = 0xfff;
          }
          else {
            bVar11 = uVar10 < 0xff;
            uVar5 = 0xff;
          }
          if (bVar11) {
            uVar5 = uVar10;
          }
          uVar4 = (uint16_t)uVar5;
          if ((int)uVar10 < 0) {
            uVar4 = 0;
          }
          dst[local_60 * (long)dst_stride + uVar7] = uVar4;
          uVar7 = uVar7 + 1;
          iVar8 = iVar8 + 1;
        } while (uVar7 != (uint)w);
      }
      local_60 = local_60 + 1;
      local_68 = local_68 + src_stride;
    } while (local_60 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_convolve_x_sr_c(const uint16_t *src, int src_stride,
                                uint16_t *dst, int dst_stride, int w, int h,
                                const InterpFilterParams *filter_params_x,
                                const int subpel_x_qn,
                                ConvolveParams *conv_params, int bd) {
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bits = FILTER_BITS - conv_params->round_0;

  assert(bits >= 0);
  assert((FILTER_BITS - conv_params->round_1) >= 0 ||
         ((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS));

  // horizontal filter
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_x->taps; ++k) {
        res += x_filter[k] * src[y * src_stride + x - fo_horiz + k];
      }
      res = ROUND_POWER_OF_TWO(res, conv_params->round_0);
      dst[y * dst_stride + x] =
          clip_pixel_highbd(ROUND_POWER_OF_TWO(res, bits), bd);
    }
  }
}